

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O0

string * statusToString_abi_cxx11_(HighsBasisStatus status,double lower,double upper)

{
  undefined1 in_SIL;
  string *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35 [20];
  allocator local_21 [33];
  
  switch(in_SIL) {
  case 0:
    if ((in_XMM0_Qa != in_XMM1_Qa) || (NAN(in_XMM0_Qa) || NAN(in_XMM1_Qa))) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"LB",local_35);
      std::allocator<char>::~allocator((allocator<char> *)local_35);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"FX",local_21);
      std::allocator<char>::~allocator((allocator<char> *)local_21);
    }
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"BS",&local_36);
    std::allocator<char>::~allocator((allocator<char> *)&local_36);
    break;
  case 2:
    if ((in_XMM0_Qa != in_XMM1_Qa) || (NAN(in_XMM0_Qa) || NAN(in_XMM1_Qa))) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"UB",&local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_38);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"FX",&local_37);
      std::allocator<char>::~allocator((allocator<char> *)&local_37);
    }
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"FR",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"NB",&local_3a);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",&local_3b);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b);
  }
  return in_RDI;
}

Assistant:

std::string statusToString(const HighsBasisStatus status, const double lower,
                           const double upper) {
  switch (status) {
    case HighsBasisStatus::kLower:
      if (lower == upper) {
        return "FX";
      } else {
        return "LB";
      }
      break;
    case HighsBasisStatus::kBasic:
      return "BS";
      break;
    case HighsBasisStatus::kUpper:
      if (lower == upper) {
        return "FX";
      } else {
        return "UB";
      }
      break;
    case HighsBasisStatus::kZero:
      return "FR";
      break;
    case HighsBasisStatus::kNonbasic:
      return "NB";
      break;
  }
  return "";
}